

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  undefined1 auVar1 [16];
  int iVar2;
  Vector3<float> *in_RCX;
  Vector3<float> *in_RDX;
  int __x;
  long *in_FS_OFFSET;
  float fVar3;
  float fVar4;
  uint uVar5;
  float val;
  float fVar6;
  float a;
  float b;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Float v_00;
  Float v_01;
  double dVar11;
  double dVar12;
  undefined1 auVar33 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar28 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  Vector3<float> VVar34;
  Vector3f VVar35;
  Float yz [2];
  Float hvsq [2];
  Float hv [2];
  Float u1 [2];
  Float yvsq;
  Float h1;
  Float h0;
  Float dd;
  Float ddsq;
  Float u0;
  Float au;
  Float sqrt;
  Float fu;
  Float fusq;
  Float invcusq;
  Float yv;
  Float xu;
  Vector3f v;
  Vector3f pq;
  Float solidAngle;
  Float b1sq;
  Float b0sq;
  Float b1;
  Float b0;
  Float g3;
  Float g2;
  Float g1;
  Float g0;
  Vector3f n3;
  Vector3f n2;
  Vector3f n1;
  Vector3f n0;
  Vector3f v11;
  Vector3f v10;
  Vector3f v01;
  Vector3f v00;
  Float y1sq;
  Float y0sq;
  Float y1;
  Float x1;
  Float y0;
  Float x0;
  Float z0sq;
  Float z0;
  Vector3f dLocal;
  Vector3f d;
  Frame R;
  Float eyl;
  Float exl;
  Point2f u;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  float x;
  undefined4 in_stack_fffffffffffffbe0;
  float fVar36;
  undefined4 in_stack_fffffffffffffbe4;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  float in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  float local_354;
  __0 local_33d;
  float local_33c;
  float local_338;
  float local_334;
  float local_330;
  float local_32c;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2fc;
  float local_2f4;
  Tuple3<pbrt::Vector3,_float> local_2f0;
  Tuple3<pbrt::Vector3,_float> local_2e0;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  Float local_2a4;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_290;
  float local_288;
  Float local_284;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  Float local_264;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  Float local_244;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c4;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined1 local_5c [24];
  undefined8 local_44;
  float local_3c;
  type local_38;
  type local_34;
  Vector3<float> *local_28;
  Vector3<float> *local_20;
  Tuple2<pbrt::Point2,_float> local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_34 = Length<float>((Vector3<float> *)0x5d020c);
  local_38 = Length<float>((Vector3<float> *)0x5d0222);
  auVar33 = (undefined1  [56])0x0;
  VVar34 = Tuple3<pbrt::Vector3,float>::operator/
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      in_stack_fffffffffffffbec);
  local_70 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar33;
  local_78 = vmovlpd_avx(auVar13._0_16_);
  auVar33 = (undefined1  [56])0x0;
  local_68 = local_78;
  local_60 = local_70;
  VVar34 = Tuple3<pbrt::Vector3,float>::operator/
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      in_stack_fffffffffffffbec);
  local_90 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar33;
  local_98 = vmovlpd_avx(auVar14._0_16_);
  local_88 = local_98;
  local_80 = local_90;
  Frame::FromXY((Vector3f *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                (Vector3f *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  VVar34 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                      ,(Point3<float> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_b0 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar33;
  local_b8 = vmovlpd_avx(auVar15._0_16_);
  local_a8 = local_b8;
  local_a0 = local_b0;
  VVar35 = Frame::ToLocal((Frame *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                          (Vector3f *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
  ;
  local_dc = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar33;
  local_d8 = vmovlpd_avx(auVar16._0_16_);
  auVar33 = (undefined1  [56])0x0;
  local_d0 = local_dc;
  local_c4 = local_d8;
  local_bc = local_dc;
  if (0.0 < local_dc) {
    VVar34 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    local_f0 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar33;
    local_f8 = vmovlpd_avx(auVar17._0_16_);
    local_dc = local_dc * -1.0;
    local_e8 = local_f8;
    local_e0 = local_f0;
    local_44 = local_f8;
    local_3c = local_f0;
  }
  local_fc = Sqr<float>(local_dc);
  local_100 = (float)local_c4;
  local_104 = local_c4._4_4_;
  local_108 = (float)local_c4 + local_34;
  local_10c = local_c4._4_4_ + local_38;
  local_110 = Sqr<float>(local_c4._4_4_);
  local_114 = Sqr<float>(local_10c);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  auVar33 = (undefined1  [56])0x0;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  VVar34 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_168 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar33;
  local_170 = vmovlpd_avx(auVar18._0_16_);
  local_160 = local_170;
  local_158 = local_168;
  VVar34 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  local_178 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar33;
  local_180 = vmovlpd_avx(auVar19._0_16_);
  local_150 = local_180;
  local_148 = local_178;
  VVar34 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_1a8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar33;
  local_1b0 = vmovlpd_avx(auVar20._0_16_);
  local_1a0 = local_1b0;
  local_198 = local_1a8;
  VVar34 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  local_1b8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar33;
  local_1c0 = vmovlpd_avx(auVar21._0_16_);
  local_190 = local_1c0;
  local_188 = local_1b8;
  VVar34 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_1e8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar33;
  local_1f0 = vmovlpd_avx(auVar22._0_16_);
  local_1e0 = local_1f0;
  local_1d8 = local_1e8;
  VVar34 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  local_1f8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar33;
  local_200 = vmovlpd_avx(auVar23._0_16_);
  local_1d0 = local_200;
  local_1c8 = local_1f8;
  VVar34 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_228 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar33;
  local_230 = vmovlpd_avx(auVar24._0_16_);
  local_220 = local_230;
  local_218 = local_228;
  VVar34 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  local_238 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = auVar33;
  local_240 = vmovlpd_avx(auVar25._0_16_);
  local_210 = local_240;
  local_208 = local_238;
  VVar34 = Tuple3<pbrt::Vector3,_float>::operator-
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  local_258 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar33;
  local_260 = vmovlpd_avx(auVar26._0_16_);
  local_250 = local_260;
  local_248 = local_258;
  local_244 = AngleBetween<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  auVar33 = extraout_var;
  VVar34 = Tuple3<pbrt::Vector3,_float>::operator-
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  local_278 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = auVar33;
  local_280 = vmovlpd_avx(auVar27._0_16_);
  local_270 = local_280;
  local_268 = local_278;
  local_264 = AngleBetween<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  auVar33 = extraout_var_00;
  VVar34 = Tuple3<pbrt::Vector3,_float>::operator-
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  local_298 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._8_56_ = auVar33;
  local_2a0 = vmovlpd_avx(auVar28._0_16_);
  local_290 = local_2a0;
  local_288 = local_298;
  local_284 = AngleBetween<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  auVar33 = extraout_var_01;
  VVar34 = Tuple3<pbrt::Vector3,_float>::operator-
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  local_2b8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar29._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._8_56_ = auVar33;
  local_2c0 = vmovlpd_avx(auVar29._0_16_);
  local_2b0 = local_2c0;
  local_2a8 = local_2b8;
  local_2a4 = AngleBetween<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  local_2c4 = local_148;
  local_2c8 = local_1c8;
  local_2cc = Sqr<float>(local_148);
  local_2d0 = Sqr<float>(local_2c8);
  local_2d4 = (local_244 + local_264 + local_284 + local_2a4) - 6.2831855;
  auVar33 = ZEXT856(0);
  if (0.001 <= local_2d4) {
    VVar34 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_310 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar31._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar31._8_56_ = auVar33;
    local_318 = vmovlpd_avx(auVar31._0_16_);
    __x = (int)local_5c;
    local_308 = local_318;
    local_300 = local_310;
    VVar35 = Frame::ToLocal((Frame *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                            (Vector3f *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    local_320 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar32._8_56_ = auVar33;
    local_328 = vmovlpd_avx(auVar32._0_16_);
    local_2fc._0_4_ = (float)local_328;
    local_32c = (float)local_2fc;
    local_2fc._4_4_ = (float)((ulong)local_328 >> 0x20);
    local_330 = local_2fc._4_4_;
    fVar6 = (float)local_2fc;
    local_2fc = local_328;
    local_2f4 = local_320;
    local_32c = Clamp<float,float,float>(fVar6,local_100,local_108);
    if ((local_32c == 0.0) && (!NAN(local_32c))) {
      local_32c = 1e-10;
    }
    fVar6 = local_fc;
    fVar3 = Sqr<float>(local_32c);
    local_334 = fVar6 / fVar3 + 1.0;
    local_338 = local_334 - local_2cc;
    dVar11 = std::sqrt((double)(ulong)(uint)local_338);
    dVar11 = std::copysign(dVar11,(double)(ulong)(uint)local_32c);
    local_33c = SUB84(dVar11,0);
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      __x = 0x3553608;
      iVar2 = __cxa_guard_acquire();
      if (iVar2 != 0) {
        InvertSphericalRectangleSample(pbrt::Point3_const&,pbrt::Point3_const&,pbrt::Vector3_const&,pbrt::Vector3_const&,pbrt::Point3_const&)
        ::$_0::operator_cast_to_function_pointer(&local_33d);
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (AccumFunc)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
        __x = 0x3553608;
        __cxa_guard_release();
      }
    }
    *(long *)(*in_FS_OFFSET + -0x438) = *(long *)(*in_FS_OFFSET + -0x438) + 1;
    if ((local_33c == 0.0) && (!NAN(local_33c))) {
      *(long *)(*in_FS_OFFSET + -0x440) = *(long *)(*in_FS_OFFSET + -0x440) + 1;
    }
    DifferenceOfProducts<float,float,float,float>
              (in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               in_stack_fffffffffffffbe8);
    fVar4 = SafeSqrt(0.0);
    fVar6 = local_2c8;
    fVar3 = local_33c;
    dVar11 = std::copysign((double)(ulong)(uint)(local_2c4 * fVar4),
                           (double)(ulong)(uint)(local_33c * local_2c4));
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)-fVar6),
                             ZEXT416(SUB84(dVar11,0) ^ 0x80000000));
    uVar5 = auVar1._0_4_;
    fVar6 = local_33c;
    fVar3 = local_2c8;
    fVar8 = local_2c4;
    std::abs(__x);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar8),
                             ZEXT416((uint)-(fVar4 * fVar6)));
    dVar11 = std::atan2((double)(ulong)uVar5,auVar1._0_8_);
    local_354 = SUB84(dVar11,0);
    if (0.0 < local_354) {
      local_354 = local_354 - 6.2831855;
    }
    if ((local_33c == 0.0) && (!NAN(local_33c))) {
      local_354 = 3.1415927;
    }
    val = (local_354 + local_284 + local_2a4) / local_2d4;
    fVar6 = Sqr<float>(local_32c);
    fVar6 = fVar6 + local_fc;
    dVar11 = std::sqrt((double)(ulong)(uint)fVar6);
    x = local_104;
    dVar12 = std::sqrt((double)(ulong)(uint)(fVar6 + local_110));
    a = x / SUB84(dVar12,0);
    fVar36 = local_10c;
    dVar12 = std::sqrt((double)(ulong)(uint)(fVar6 + local_114));
    b = fVar36 / SUB84(dVar12,0);
    fVar7 = Sqr<float>(local_330);
    fVar3 = DifferenceOfProducts<float,float,float,float>
                      (in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                       ,in_stack_fffffffffffffbe8);
    fVar8 = a - b;
    std::abs(__x);
    dVar12 = std::sqrt((double)(ulong)(uint)(fVar7 * (fVar6 + fVar7)));
    fVar4 = fVar3 - (fVar8 * SUB84(dVar12,0)) / (fVar6 + fVar7);
    fVar9 = Sqr<float>(a - b);
    fVar3 = DifferenceOfProducts<float,float,float,float>
                      (in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0,fVar4,fVar3);
    fVar10 = a - b;
    std::abs(__x);
    dVar12 = std::sqrt((double)(ulong)(uint)(fVar7 * (fVar6 + fVar7)));
    fVar3 = fVar3 + (fVar10 * SUB84(dVar12,0)) / (fVar6 + fVar7);
    fVar6 = Sqr<float>(a - b);
    v_00 = Lerp(fVar4 / fVar9,a,b);
    v_01 = Lerp(fVar3 / fVar6,a,b);
    fVar3 = Sqr<float>(v_00);
    fVar4 = Sqr<float>(v_01);
    fVar6 = v_00 * SUB84(dVar11,0);
    dVar12 = std::sqrt((double)(ulong)(uint)(1.0 - fVar3));
    fVar3 = v_01 * SUB84(dVar11,0);
    dVar11 = std::sqrt((double)(ulong)(uint)(1.0 - fVar4));
    fVar6 = fVar6 / SUB84(dVar12,0) - local_330;
    std::abs(__x);
    fVar3 = fVar3 / SUB84(dVar11,0) - local_330;
    std::abs(__x);
    if (fVar3 <= fVar6) {
      Clamp<float,int,int>(val,0,1);
      Point2<float>::Point2((Point2<float> *)CONCAT44(fVar8,fVar36),x,in_stack_fffffffffffffbd8);
    }
    else {
      Clamp<float,int,int>(val,0,1);
      Point2<float>::Point2((Point2<float> *)CONCAT44(fVar8,fVar36),x,in_stack_fffffffffffffbd8);
    }
  }
  else {
    VVar34 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                        (Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_2f0.z = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar30._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar30._8_56_ = auVar33;
    local_2f0._0_8_ = vmovlpd_avx(auVar30._0_16_);
    local_2e0._0_8_ = local_2f0._0_8_;
    local_2e0.z = local_2f0.z;
    Dot<float>((Vector3<float> *)&local_2e0,local_20);
    LengthSquared<float>(local_20);
    Dot<float>((Vector3<float> *)&local_2e0,local_28);
    LengthSquared<float>(local_28);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8);
  }
  return (Point2f)local_8;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}